

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_shuffle_8(c_v64 a,c_v64 pattern)

{
  int c;
  long lVar1;
  c_v64 t;
  byte local_18 [16];
  c_v64 local_8;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 8) {
      return (c_v64)local_8.u64;
    }
    if (7 < local_18[lVar1]) break;
    local_8.u8[lVar1] = local_18[(ulong)(uint)local_18[lVar1] + 8];
    lVar1 = lVar1 + 1;
  }
  fprintf(_stderr,"Error: Undefined v64_shuffle_8 index %d/%d\n");
  abort();
}

Assistant:

SIMD_INLINE c_v64 c_v64_shuffle_8(c_v64 a, c_v64 pattern) {
  c_v64 t;
  int c;
  for (c = 0; c < 8; c++) {
    if (SIMD_CHECK && (pattern.u8[c] & ~7)) {
      fprintf(stderr, "Error: Undefined v64_shuffle_8 index %d/%d\n",
              pattern.u8[c], c);
      abort();
    }
    t.u8[c] =
        a.u8[CONFIG_BIG_ENDIAN ? 7 - (pattern.u8[c] & 7) : pattern.u8[c] & 7];
  }
  return t;
}